

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  cmConditionEvaluator *pcVar4;
  cmConditionEvaluator *pcVar5;
  string *psVar6;
  char *pcVar7;
  ostream *poVar8;
  size_t sVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  PolicyID id;
  _Self __tmp_1;
  _List_node_base *p_Var11;
  cmState *pcVar12;
  element_type *peVar13;
  cmConditionEvaluator *this_00;
  cmMakefile *pcVar14;
  _Self __tmp;
  iterator iVar15;
  _Self __tmp_2;
  cmExpandedCommandArgument *pcVar16;
  iterator iVar17;
  cmExpandedCommandArgument *argument;
  iterator argP2;
  int reducible;
  iterator arg;
  char *def;
  string def_buf;
  RegularExpression regEntry;
  ostringstream error;
  iterator local_358;
  int local_34c;
  iterator local_348;
  iterator local_340;
  cmConditionEvaluator *local_338;
  _List_node_base *local_330;
  cmConditionEvaluator *local_328;
  char *local_320;
  undefined1 local_318 [64];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_298 [80];
  char *local_248;
  char *local_1f8;
  char *local_1d8;
  undefined1 local_1c8 [32];
  bool local_1a8;
  ios_base local_158 [264];
  string local_50 [16];
  size_type local_40 [2];
  
  local_328 = (cmConditionEvaluator *)local_318;
  local_320 = (char *)0x0;
  local_318[0] = 0;
  local_2b8._16_8_ = errorString;
  local_2b8._24_8_ = status;
  while( true ) {
    local_34c = 0;
    local_340._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_358._M_node = (_List_node_base *)0x0;
    if (local_340._M_node == (_List_node_base *)newArgs) break;
    do {
      local_348._M_node = local_340._M_node;
      if ((local_340._M_node != (_List_node_base *)newArgs) &&
         (local_348._M_node = (local_340._M_node)->_M_next, local_358._M_node = local_348._M_node,
         local_348._M_node != (_List_node_base *)newArgs)) {
        local_358._M_node = (local_348._M_node)->_M_next;
      }
      iVar17._M_node = local_348._M_node;
      iVar15._M_node = local_358._M_node;
      if (((local_348._M_node != (_List_node_base *)newArgs) &&
          (local_358._M_node != (_List_node_base *)newArgs)) &&
         (bVar1 = IsKeyword(this,&keyMATCHES_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_348._M_node + 1)), bVar1)) {
        local_330 = local_340._M_node;
        pcVar16 = (cmExpandedCommandArgument *)(local_340._M_node + 1);
        pcVar4 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar16);
        if (pcVar4 == (cmConditionEvaluator *)0x0) {
          pcVar4 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar16);
        }
        local_338 = pcVar4;
        pcVar5 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar16);
        if (pcVar4 != pcVar5) {
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar16);
          iVar3 = strncmp((psVar6->_M_dataplus)._M_p,"CMAKE_MATCH_",0xc);
          pcVar7 = local_320;
          pcVar4 = local_338;
          if (iVar3 == 0) {
            strlen((char *)local_338);
            std::__cxx11::string::_M_replace((ulong)&local_328,0,pcVar7,(ulong)pcVar4);
            local_338 = local_328;
          }
        }
        pcVar7 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)(iVar15._M_node + 1))
        ;
        cmMakefile::ClearMatches(this->Makefile);
        local_298._0_8_ = (pointer)0x0;
        local_248 = (char *)0x0;
        local_1f8 = (char *)0x0;
        local_1d8 = (char *)0x0;
        bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_298,pcVar7);
        if (bVar1) {
          bVar2 = cmsys::RegularExpression::find
                            ((RegularExpression *)local_298,(char *)local_338,
                             (RegularExpressionMatch *)local_298);
          if (bVar2) {
            cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_298);
            local_2d8._16_8_ = local_2b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_2d8 + 0x10),"1","");
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)local_1c8,(string *)(local_2d8 + 0x10),true);
            std::__cxx11::string::operator=((string *)pcVar16,(string *)local_1c8);
            p_Var11 = local_330;
            *(bool *)&local_330[3]._M_next = local_1a8;
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            pcVar12 = (cmState *)local_2b8._0_8_;
            peVar13 = (element_type *)local_2d8._16_8_;
            if ((element_type *)local_2d8._16_8_ != (element_type *)local_2b8) {
LAB_00368e34:
              operator_delete(peVar13,(ulong)&(pcVar12->PropertyDefinitions)._M_t._M_impl.field_0x1)
              ;
            }
          }
          else {
            local_318._48_8_ = local_2d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_318 + 0x30),"0","");
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)local_1c8,(string *)(local_318 + 0x30),true);
            std::__cxx11::string::operator=((string *)pcVar16,(string *)local_1c8);
            p_Var11 = local_330;
            *(bool *)&local_330[3]._M_next = local_1a8;
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            pcVar12 = (cmState *)local_2d8._0_8_;
            peVar13 = (element_type *)local_318._48_8_;
            if ((element_type *)local_318._48_8_ != (element_type *)local_2d8) goto LAB_00368e34;
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar15);
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar17);
          local_348._M_node = p_Var11;
          if ((p_Var11 != (_List_node_base *)newArgs) &&
             (local_348._M_node = p_Var11->_M_next, local_358._M_node = local_348._M_node,
             local_348._M_node != (_List_node_base *)newArgs)) {
            local_358._M_node = (local_348._M_node)->_M_next;
          }
          local_34c = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,"Regular expression \"",0x14);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffc88 +
                            (int)*(undefined8 *)(local_1c8._0_8_ + -0x18) + 0x1b0);
          }
          else {
            sVar9 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar7,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,"\" cannot compile",0x10);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_2b8._16_8_,local_50);
          if ((size_type *)local_50._0_8_ != local_40) {
            operator_delete((void *)local_50._0_8_,local_40[0] + 1);
          }
          *(MessageType *)local_2b8._24_8_ = FATAL_ERROR;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
        }
        if (local_1d8 != (char *)0x0) {
          operator_delete__(local_1d8);
        }
        if (!bVar1) {
          bVar1 = false;
          goto LAB_003698b2;
        }
      }
      iVar17._M_node = local_340._M_node;
      iVar15._M_node = local_348._M_node;
      if (local_348._M_node != (_List_node_base *)newArgs) {
        pcVar16 = (cmExpandedCommandArgument *)(local_340._M_node + 1);
        bVar1 = IsKeyword(this,&keyMATCHES_abi_cxx11_,pcVar16);
        if (bVar1) {
          local_318._16_8_ = local_318 + 0x20;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_318 + 0x10),"0","");
          cmExpandedCommandArgument::cmExpandedCommandArgument
                    ((cmExpandedCommandArgument *)local_1c8,(string *)(local_318 + 0x10),true);
          std::__cxx11::string::operator=((string *)pcVar16,(string *)local_1c8);
          *(bool *)&iVar17._M_node[3]._M_next = local_1a8;
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if ((undefined1 *)local_318._16_8_ != local_318 + 0x20) {
            operator_delete((void *)local_318._16_8_,local_318._32_8_ + 1);
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar15);
          local_348._M_node = iVar17._M_node;
          if ((iVar17._M_node != (_List_node_base *)newArgs) &&
             (local_348._M_node = (iVar17._M_node)->_M_next, local_358._M_node = local_348._M_node,
             local_348._M_node != (_List_node_base *)newArgs)) {
            local_358._M_node = (local_348._M_node)->_M_next;
          }
          local_34c = 1;
          iVar15._M_node = local_348._M_node;
        }
      }
      iVar17._M_node = local_358._M_node;
      if ((iVar15._M_node != (_List_node_base *)newArgs) &&
         (local_358._M_node != (_List_node_base *)newArgs)) {
        pcVar4 = (cmConditionEvaluator *)(iVar15._M_node + 1);
        bVar1 = IsKeyword(this,&keyLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar4);
        if ((bVar1) ||
           ((((bVar1 = IsKeyword(this,&keyLESS_EQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar4)
              , bVar1 ||
              (bVar1 = IsKeyword(this,&keyGREATER_abi_cxx11_,(cmExpandedCommandArgument *)pcVar4),
              bVar1)) ||
             (bVar1 = IsKeyword(this,&keyGREATER_EQUAL_abi_cxx11_,
                                (cmExpandedCommandArgument *)pcVar4), bVar1)) ||
            (bVar1 = IsKeyword(this,&keyEQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar4), bVar1
            )))) {
          pcVar16 = (cmExpandedCommandArgument *)(local_340._M_node + 1);
          pcVar5 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar16);
          if (pcVar5 == (cmConditionEvaluator *)0x0) {
            pcVar5 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar16);
          }
          local_338 = pcVar5;
          pcVar5 = (cmConditionEvaluator *)
                   GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar17._M_node + 1));
          if (pcVar5 == (cmConditionEvaluator *)0x0) {
            pcVar5 = (cmConditionEvaluator *)
                     cmExpandedCommandArgument::c_str
                               ((cmExpandedCommandArgument *)(iVar17._M_node + 1));
          }
          bVar1 = false;
          this_00 = local_338;
          iVar3 = __isoc99_sscanf(local_338,"%lg",local_1c8);
          if (iVar3 == 1) {
            bVar1 = false;
            iVar3 = __isoc99_sscanf(pcVar5,"%lg",local_298);
            this_00 = pcVar5;
            if (iVar3 == 1) {
              this_00 = pcVar4;
              bVar1 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar4,&keyLESS_abi_cxx11_);
              if (bVar1) {
                bVar1 = (double)local_298._0_8_ == (double)local_1c8._0_8_;
                bVar2 = (double)local_298._0_8_ < (double)local_1c8._0_8_;
LAB_003691a3:
                bVar1 = !bVar2 && !bVar1;
              }
              else {
                pcVar5 = pcVar4;
                bVar1 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar4,&keyLESS_EQUAL_abi_cxx11_);
                if (bVar1) {
                  bVar1 = (double)local_298._0_8_ < (double)local_1c8._0_8_;
                  pcVar4 = pcVar5;
                }
                else {
                  this_00 = pcVar4;
                  bVar1 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar4,&keyGREATER_abi_cxx11_);
                  if (bVar1) {
                    bVar1 = (double)local_1c8._0_8_ == (double)local_298._0_8_;
                    bVar2 = (double)local_1c8._0_8_ < (double)local_298._0_8_;
                    goto LAB_003691a3;
                  }
                  bVar1 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar4,
                                     &keyGREATER_EQUAL_abi_cxx11_);
                  if (!bVar1) {
                    bVar1 = (bool)(-((double)local_1c8._0_8_ == (double)local_298._0_8_) & 1);
                    this_00 = pcVar4;
                    goto LAB_003691d4;
                  }
                  bVar1 = (double)local_1c8._0_8_ < (double)local_298._0_8_;
                }
                bVar1 = !bVar1;
                this_00 = pcVar4;
              }
            }
          }
LAB_003691d4:
          HandleBinaryOp(this_00,bVar1,&local_34c,&local_340,newArgs,&local_348,&local_358);
        }
      }
      iVar17._M_node = local_348._M_node;
      iVar15._M_node = local_358._M_node;
      if ((local_348._M_node != (_List_node_base *)newArgs) &&
         (local_358._M_node != (_List_node_base *)newArgs)) {
        pcVar4 = (cmConditionEvaluator *)(local_348._M_node + 1);
        bVar1 = IsKeyword(this,&keySTRLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar4);
        if ((((bVar1) ||
             ((bVar1 = IsKeyword(this,&keySTRLESS_EQUAL_abi_cxx11_,
                                 (cmExpandedCommandArgument *)pcVar4), bVar1 ||
              (bVar1 = IsKeyword(this,&keySTRGREATER_abi_cxx11_,(cmExpandedCommandArgument *)pcVar4)
              , bVar1)))) ||
            (bVar1 = IsKeyword(this,&keySTRGREATER_EQUAL_abi_cxx11_,
                               (cmExpandedCommandArgument *)pcVar4), bVar1)) ||
           (bVar1 = IsKeyword(this,&keySTREQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar4),
           bVar1)) {
          pcVar16 = (cmExpandedCommandArgument *)(local_340._M_node + 1);
          pcVar5 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar16);
          if (pcVar5 == (cmConditionEvaluator *)0x0) {
            pcVar5 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar16);
          }
          local_338 = pcVar5;
          pcVar7 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar15._M_node + 1));
          if (pcVar7 == (char *)0x0) {
            pcVar7 = cmExpandedCommandArgument::c_str
                               ((cmExpandedCommandArgument *)(iVar15._M_node + 1));
          }
          iVar3 = strcmp((char *)local_338,pcVar7);
          pcVar5 = pcVar4;
          bVar1 = cmExpandedCommandArgument::operator==
                            ((cmExpandedCommandArgument *)pcVar4,&keySTRLESS_abi_cxx11_);
          if (bVar1) {
            bVar1 = SUB41((uint)iVar3 >> 0x1f,0);
            pcVar4 = pcVar5;
          }
          else {
            pcVar5 = pcVar4;
            bVar1 = cmExpandedCommandArgument::operator==
                              ((cmExpandedCommandArgument *)pcVar4,&keySTRLESS_EQUAL_abi_cxx11_);
            if (bVar1) {
              bVar1 = iVar3 < 1;
              pcVar4 = pcVar5;
            }
            else {
              pcVar5 = pcVar4;
              bVar1 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar4,&keySTRGREATER_abi_cxx11_);
              if (bVar1) {
                bVar1 = 0 < iVar3;
                pcVar4 = pcVar5;
              }
              else {
                bVar1 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar4,
                                   &keySTRGREATER_EQUAL_abi_cxx11_);
                if (bVar1) {
                  bVar1 = -1 < iVar3;
                }
                else {
                  bVar1 = iVar3 == 0;
                }
              }
            }
          }
          HandleBinaryOp(pcVar4,bVar1,&local_34c,&local_340,newArgs,&local_348,&local_358);
          iVar17._M_node = local_348._M_node;
        }
      }
      iVar15._M_node = local_358._M_node;
      if ((iVar17._M_node != (_List_node_base *)newArgs) &&
         (local_358._M_node != (_List_node_base *)newArgs)) {
        pcVar16 = (cmExpandedCommandArgument *)(iVar17._M_node + 1);
        bVar1 = IsKeyword(this,&keyVERSION_LESS_abi_cxx11_,pcVar16);
        if (((bVar1) ||
            (((bVar1 = IsKeyword(this,&keyVERSION_LESS_EQUAL_abi_cxx11_,pcVar16), bVar1 ||
              (bVar1 = IsKeyword(this,&keyVERSION_GREATER_abi_cxx11_,pcVar16), bVar1)) ||
             (bVar1 = IsKeyword(this,&keyVERSION_GREATER_EQUAL_abi_cxx11_,pcVar16), bVar1)))) ||
           (bVar1 = IsKeyword(this,&keyVERSION_EQUAL_abi_cxx11_,pcVar16), bVar1)) {
          argument = (cmExpandedCommandArgument *)(local_340._M_node + 1);
          pcVar4 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,argument);
          if (pcVar4 == (cmConditionEvaluator *)0x0) {
            pcVar4 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(argument);
          }
          local_338 = pcVar4;
          pcVar7 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar15._M_node + 1));
          if (pcVar7 == (char *)0x0) {
            pcVar7 = cmExpandedCommandArgument::c_str
                               ((cmExpandedCommandArgument *)(iVar15._M_node + 1));
          }
          bVar1 = cmExpandedCommandArgument::operator==(pcVar16,&keyVERSION_LESS_abi_cxx11_);
          pcVar4 = (cmConditionEvaluator *)0x2;
          if (!bVar1) {
            bVar1 = cmExpandedCommandArgument::operator==(pcVar16,&keyVERSION_LESS_EQUAL_abi_cxx11_)
            ;
            pcVar4 = (cmConditionEvaluator *)0x3;
            if (!bVar1) {
              bVar1 = cmExpandedCommandArgument::operator==(pcVar16,&keyVERSION_GREATER_abi_cxx11_);
              pcVar4 = (cmConditionEvaluator *)0x4;
              if (!bVar1) {
                bVar1 = cmExpandedCommandArgument::operator==
                                  (pcVar16,&keyVERSION_GREATER_EQUAL_abi_cxx11_);
                pcVar4 = (cmConditionEvaluator *)(ulong)((uint)bVar1 * 4 + 1);
              }
            }
          }
          bVar1 = cmSystemTools::VersionCompare((CompareOp)pcVar4,(char *)local_338,pcVar7);
          HandleBinaryOp(pcVar4,bVar1,&local_34c,&local_340,newArgs,&local_348,&local_358);
        }
      }
      iVar17._M_node = local_348._M_node;
      iVar15._M_node = local_358._M_node;
      if (((local_348._M_node != (_List_node_base *)newArgs) &&
          (local_358._M_node != (_List_node_base *)newArgs)) &&
         (bVar1 = IsKeyword(this,&keyIS_NEWER_THAN_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_348._M_node + 1)), bVar1)) {
        local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
        pcVar4 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(local_340._M_node + 1));
        psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(iVar15._M_node + 1));
        bVar1 = cmsys::SystemTools::FileTimeCompare((string *)pcVar4,psVar6,(int *)local_1c8);
        HandleBinaryOp(pcVar4,(uint)local_1c8._0_4_ < 2 || !bVar1,&local_34c,&local_340,newArgs,
                       &local_348,&local_358);
        iVar17._M_node = local_348._M_node;
      }
      iVar15._M_node = local_358._M_node;
      if (((iVar17._M_node != (_List_node_base *)newArgs) &&
          (local_358._M_node != (_List_node_base *)newArgs)) &&
         (bVar1 = IsKeyword(this,&keyIN_LIST_abi_cxx11_,
                            (cmExpandedCommandArgument *)(iVar17._M_node + 1)), bVar1)) {
        if (this->Policy57Status < NEW) {
          if (this->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_298,(cmPolicies *)0x39,id);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1c8,(char *)local_298._0_8_,local_298._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,
                       "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       ,0x85);
            pcVar14 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar14,AUTHOR_WARNING,(string *)local_298);
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
          }
        }
        else {
          pcVar16 = (cmExpandedCommandArgument *)(local_340._M_node + 1);
          pcVar4 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(this,pcVar16);
          if (pcVar4 == (cmConditionEvaluator *)0x0) {
            pcVar4 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar16);
          }
          pcVar14 = this->Makefile;
          local_338 = pcVar4;
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(iVar15._M_node + 1));
          pcVar7 = cmMakefile::GetDefinition(pcVar14,psVar6);
          if (pcVar7 == (char *)0x0) {
            bVar1 = false;
          }
          else {
            local_298._0_8_ = (pointer)0x0;
            local_298._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_298._16_8_ = (char *)0x0;
            local_1c8._0_8_ = local_1c8 + 0x10;
            sVar9 = strlen(pcVar7);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,pcVar7,pcVar7 + sVar9);
            cmSystemTools::ExpandListArgument
                      ((string *)local_1c8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_298,true);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            _Var10 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                               (local_298._0_8_,local_298._8_8_,&local_338);
            bVar1 = _Var10._M_current !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_298._8_8_;
            pcVar14 = (cmMakefile *)local_298;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pcVar14);
          }
          HandleBinaryOp((cmConditionEvaluator *)pcVar14,bVar1,&local_34c,&local_340,newArgs,
                         &local_348,&local_358);
        }
      }
      local_340._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &(local_340._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (local_340._M_node != (_List_node_base *)newArgs);
    if (local_34c == 0) break;
  }
  bVar1 = true;
LAB_003698b2:
  if (local_328 != (cmConditionEvaluator *)local_318) {
    operator_delete(local_328,CONCAT71(local_318._1_7_,local_318[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  int reducible;
  std::string def_buf;
  const char* def;
  const char* def2;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          IsKeyword(keyMATCHES, *argP1)) {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_")) {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
        }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if (!regEntry.compile(rex)) {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = MessageType::FATAL_ERROR;
          return false;
        }
        if (regEntry.find(def)) {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyMATCHES, *arg)) {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyLESS, *argP1) ||
           this->IsKeyword(keyLESS_EQUAL, *argP1) ||
           this->IsKeyword(keyGREATER, *argP1) ||
           this->IsKeyword(keyGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyEQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if (sscanf(def, "%lg", &lhs) != 1 || sscanf(def2, "%lg", &rhs) != 1) {
          result = false;
        } else if (*(argP1) == keyLESS) {
          result = (lhs < rhs);
        } else if (*(argP1) == keyLESS_EQUAL) {
          result = (lhs <= rhs);
        } else if (*(argP1) == keyGREATER) {
          result = (lhs > rhs);
        } else if (*(argP1) == keyGREATER_EQUAL) {
          result = (lhs >= rhs);
        } else {
          result = (lhs == rhs);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keySTRLESS, *argP1) ||
           this->IsKeyword(keySTRLESS_EQUAL, *argP1) ||
           this->IsKeyword(keySTRGREATER, *argP1) ||
           this->IsKeyword(keySTRGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keySTREQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def, def2);
        bool result;
        if (*(argP1) == keySTRLESS) {
          result = (val < 0);
        } else if (*(argP1) == keySTRLESS_EQUAL) {
          result = (val <= 0);
        } else if (*(argP1) == keySTRGREATER) {
          result = (val > 0);
        } else if (*(argP1) == keySTRGREATER_EQUAL) {
          result = (val >= 0);
        } else // strequal
        {
          result = (val == 0);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyVERSION_LESS, *argP1) ||
           this->IsKeyword(keyVERSION_LESS_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_EQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op;
        if (*argP1 == keyVERSION_LESS) {
          op = cmSystemTools::OP_LESS;
        } else if (*argP1 == keyVERSION_LESS_EQUAL) {
          op = cmSystemTools::OP_LESS_EQUAL;
        } else if (*argP1 == keyVERSION_GREATER) {
          op = cmSystemTools::OP_GREATER;
        } else if (*argP1 == keyVERSION_GREATER_EQUAL) {
          op = cmSystemTools::OP_GREATER_EQUAL;
        } else { // version_equal
          op = cmSystemTools::OP_EQUAL;
        }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIS_NEWER_THAN, *argP1)) {
        int fileIsNewer = 0;
        bool success = cmSystemTools::FileTimeCompare(
          arg->GetValue(), (argP2)->GetValue(), &fileIsNewer);
        this->HandleBinaryOp(
          (!success || fileIsNewer == 1 || fileIsNewer == 0), reducible, arg,
          newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIN_LIST, *argP1)) {
        if (this->Policy57Status != cmPolicies::OLD &&
            this->Policy57Status != cmPolicies::WARN) {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if (def2) {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
          }

          this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
        } else if (this->Policy57Status == cmPolicies::WARN) {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
          e << "IN_LIST will be interpreted as an operator "
               "when the policy is set to NEW.  "
               "Since the policy is not set the OLD behavior will be used.";

          this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        }
      }

      ++arg;
    }
  } while (reducible);
  return true;
}